

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O3

void __thiscall
JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::~GrowingArray
          (GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this)

{
  if (this->buffer != (Type)0x0) {
    if (0x3fffffff < (ulong)this->length) {
      Math::DefaultOverflowPolicy();
    }
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
               this->buffer,(ulong)this->length << 2);
  }
  return;
}

Assistant:

~GrowingArray()
        {
            if (buffer != nullptr)
            {
                AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, UInt32Math::Mul(length, sizeof(TValue)));
            }
        }